

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

double gl4cts::Math::smoothStep<double>(double e0,double e1,double val)

{
  double dVar1;
  double result;
  double temp;
  double val_local;
  double e1_local;
  double e0_local;
  
  if (e0 < val) {
    if (val < e1) {
      dVar1 = (val - e0) / (e1 - e0);
      e0_local = dVar1 * dVar1 * (3.0 - (dVar1 + dVar1));
    }
    else {
      e0_local = 1.0;
    }
  }
  else {
    e0_local = 0.0;
  }
  return e0_local;
}

Assistant:

static T smoothStep(T e0, T e1, T val)
{
	if (e0 >= val)
	{
		return 0;
	}

	if (e1 <= val)
	{
		return 1;
	}

	T temp = (val - e0) / (e1 - e0);

	T result = temp * temp * (3 - 2 * temp);

	return result;
}